

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__s;
  char *__s_00;
  char *__s_01;
  pointer prVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Image *src;
  int x;
  int iVar15;
  uint __val;
  ulong uVar16;
  uchar *puVar17;
  Image map_image;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out_filename;
  vector<room_t,_std::allocator<room_t>_> rooms;
  vector<Image,_std::allocator<Image>_> tile_images;
  string __str;
  vector<monster_t,_std::allocator<monster_t>_> monster_data;
  vector<Image,_std::allocator<Image>_> monster_mask_images;
  vector<Image,_std::allocator<Image>_> monster_images;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  vector<room_t,_std::allocator<room_t>_> local_120;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  vector<Image,_std::allocator<Image>_> local_e8;
  long *local_d0 [2];
  long local_c0 [2];
  size_type local_b0;
  long local_a8;
  long local_a0;
  char *local_98;
  long local_90;
  ulong local_88;
  pointer local_80;
  vector<monster_t,_std::allocator<monster_t>_> local_78;
  vector<Image,_std::allocator<Image>_> local_60;
  vector<Image,_std::allocator<Image>_> local_48;
  
  if (argc < 7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10e170);
    }
    else {
      sVar7 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," egapics.pic pymon.pic pymask.pic pymon.dat in.rms prefix\n",
               0x3a);
    iVar11 = 1;
  }
  else {
    pcVar1 = argv[2];
    __s = argv[3];
    __s_00 = argv[4];
    __s_01 = argv[5];
    local_98 = argv[6];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,argv[1],(allocator<char> *)&local_140);
    LoadSpritesheet(&local_e8,(string *)local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_160._4_4_,local_160._0_4_),
                      local_150._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,pcVar1,(allocator<char> *)&local_140);
    LoadSpritesheet(&local_48,(string *)local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_160._4_4_,local_160._0_4_),
                      local_150._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,__s,(allocator<char> *)&local_140);
    LoadSpritesheet(&local_60,(string *)local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_160._4_4_,local_160._0_4_),
                      local_150._M_allocated_capacity + 1);
    }
    iVar11 = (local_e8.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
              super__Vector_impl_data._M_start)->width_;
    iVar15 = (local_e8.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
              super__Vector_impl_data._M_start)->height_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,__s_01,(allocator<char> *)&local_140);
    LoadRooms(&local_120,(string *)local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_160._4_4_,local_160._0_4_),
                      local_150._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_160,__s_00,(allocator<char> *)&local_140);
    LoadMonsterData(&local_78,(string *)local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_160._4_4_,local_160._0_4_) != &local_150) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_160._4_4_,local_160._0_4_),
                      local_150._M_allocated_capacity + 1);
    }
    if (local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_a8 = (long)iVar11 * 0x14;
      local_a0 = (long)iVar15 * 8;
      local_b0 = local_a0 * local_a8;
      lVar12 = 0xa0;
      uVar16 = 0;
      do {
        prVar2 = local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_160._0_4_ = (undefined4)local_a8;
        local_160._4_4_ = (undefined4)local_a0;
        local_140 = (long *)((ulong)local_140 & 0xffffffffff000000);
        std::vector<color_t,_std::allocator<color_t>_>::vector
                  ((vector<color_t,_std::allocator<color_t>_> *)(local_160 + 8),local_b0,
                   (value_type *)&local_140,(allocator_type *)&local_108);
        local_80 = prVar2 + uVar16;
        puVar17 = (prVar2->tiles)._M_elems + lVar12;
        lVar13 = 0;
        local_90 = lVar12;
        local_88 = uVar16;
        do {
          lVar12 = 0;
          do {
            if (puVar17[lVar12 + -0xa0] != '\0') {
              bVar4 = puVar17[lVar12 + -0xa0] - 1;
              uVar14 = (uint)bVar4;
              if ((ulong)((long)local_e8.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_e8.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                super__Vector_impl_data._M_start >> 5) <= (ulong)bVar4) {
                uVar14 = 0x14;
              }
              uVar16 = (ulong)(uVar14 << 5);
              iVar15 = (int)lVar12;
              iVar11 = (int)lVar13;
              Image::Blit((Image *)local_160,
                          (Image *)((long)&(local_e8.
                                            super__Vector_base<Image,_std::allocator<Image>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->width_ +
                                   uVar16),
                          *(int *)((long)&(local_e8.
                                           super__Vector_base<Image,_std::allocator<Image>_>._M_impl
                                           .super__Vector_impl_data._M_start)->width_ + uVar16) *
                          iVar15,*(int *)((long)&(local_e8.
                                                  super__Vector_base<Image,_std::allocator<Image>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->height_
                                         + uVar16) * iVar11);
              bVar4 = puVar17[lVar12];
              if (bVar4 != 0) {
                if (bVar4 < 100) {
                  uVar16 = (ulong)local_78.super__Vector_base<monster_t,_std::allocator<monster_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(ulong)local_80->monster_id - 1].gfx;
                  Image::Blit((Image *)local_160,
                              local_48.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_start + (uVar16 - 1),
                              local_60.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_start + (uVar16 - 1),
                              local_48.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar16 - 1].width_ * iVar15,
                              local_48.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar16 - 1].height_ * iVar11);
                }
                else {
                  uVar14 = GetObjectTile(bVar4);
                  iVar5 = GetObjectTileMask(bVar4);
                  src = (Image *)((long)&(local_e8.super__Vector_base<Image,_std::allocator<Image>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->width_ +
                                 (ulong)((uVar14 & 0xff) << 5));
                  if (iVar5 == 0) {
                    Image::Blit((Image *)local_160,src,src->width_ * iVar15,src->height_ * iVar11);
                  }
                  else {
                    Image::Blit((Image *)local_160,src,
                                local_e8.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar5,src->width_ * iVar15,
                                src->height_ * iVar11);
                  }
                }
              }
            }
            uVar16 = local_88;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x14);
          lVar13 = lVar13 + 1;
          puVar17 = puVar17 + 0x14;
        } while (lVar13 != 8);
        uVar14 = 1;
        __val = (uint)local_88;
        if (9 < local_88) {
          uVar3 = 4;
          uVar9 = local_88;
          do {
            uVar14 = uVar3;
            uVar6 = (uint)uVar9;
            if (uVar6 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_00102889;
            }
            if (uVar6 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_00102889;
            }
            if (uVar6 < 10000) goto LAB_00102889;
            uVar9 = (uVar9 & 0xffffffff) / 10000;
            uVar3 = uVar14 + 4;
          } while (99999 < uVar6);
          uVar14 = uVar14 + 1;
        }
LAB_00102889:
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct((ulong)local_d0,(char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0[0],uVar14,__val);
        pcVar1 = local_98;
        strlen(local_98);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,(ulong)pcVar1);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_f8 = *plVar10;
          lStack_f0 = plVar8[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar10;
          local_108 = (long *)*plVar8;
        }
        local_100 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_130 = *plVar10;
          lStack_128 = plVar8[3];
          local_140 = &local_130;
        }
        else {
          local_130 = *plVar10;
          local_140 = (long *)*plVar8;
        }
        local_138 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        lVar12 = local_90;
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        stbi_write_png((char *)local_140,local_160._0_4_,local_160._4_4_,3,(void *)local_160._8_8_,
                       local_160._0_4_ * 3);
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if ((pointer)local_160._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_160._8_8_,local_150._8_8_ - local_160._8_8_);
        }
        uVar16 = uVar16 + 1;
        uVar9 = ((long)local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                      super__Vector_impl_data._M_start) * -0x18e6527af1373f07;
        lVar12 = lVar12 + 0x149;
      } while (uVar16 <= uVar9 && uVar9 - uVar16 != 0);
    }
    if (local_78.super__Vector_base<monster_t,_std::allocator<monster_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<monster_t,_std::allocator<monster_t>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<monster_t,_std::allocator<monster_t>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<monster_t,_std::allocator<monster_t>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<Image,_std::allocator<Image>_>::~vector(&local_60);
    std::vector<Image,_std::allocator<Image>_>::~vector(&local_48);
    std::vector<Image,_std::allocator<Image>_>::~vector(&local_e8);
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int main(int argc, char** argv) {
  if (argc < 7) {
    std::cerr << "Usage: " << argv[0]
              << " egapics.pic pymon.pic pymask.pic pymon.dat in.rms prefix\n";
    return 1;
  }

  auto const egapics_filename = argv[1];
  auto const pymon_filename = argv[2];
  auto const pymask_filename = argv[3];
  auto const pymon_dat_filename = argv[4];
  auto const rms_filename = argv[5];
  auto const out_prefix = argv[6];

  auto const tile_images = LoadSpritesheet(egapics_filename);
  auto const monster_images = LoadSpritesheet(pymon_filename);
  auto const monster_mask_images = LoadSpritesheet(pymask_filename);
  auto const tile_width = tile_images[0].GetWidth();
  auto const tile_height = tile_images[0].GetHeight();

  auto const rooms = LoadRooms(rms_filename);
  auto const monster_data = LoadMonsterData(pymon_dat_filename);

  for (auto room_index = 0; room_index < rooms.size(); ++room_index) {
    auto const& room = rooms[room_index];
    Image map_image(tile_width * kRoomWidth, tile_height * kRoomHeight);

    // TODO: Cheaters versions of the maps
    // Make glass walls visible
    // No magical darkness
    // Highlight important traps
    // Reveal soft walls and secret doors
    // No fog
    // Easier to see Quasits

    for (auto y = 0; y < kRoomHeight; ++y) {
      for (auto x = 0; x < kRoomWidth; ++x) {
        // FIRST do tile
        auto tile = room.tiles[y * kRoomWidth + x];

        // 0 is null, nothing here
        if (tile == 0) {
          continue;
        }
        tile -= 1;

        // TODO: There are many kinds of traps (wands, XP) but they're stored as
        // ASCII chars. Figure them out
        if (tile >= tile_images.size()) {
          tile = 20;
        }

        auto const& tile_img = tile_images[tile];
        map_image.Blit(tile_img, x * tile_img.GetWidth(),
                       y * tile_img.GetHeight());

        // SECOND do object
        auto object = room.objects[y * kRoomWidth + x];

        // 0 is null, nothing here
        if (object == 0) {
          continue;
        }

        // Monsters (with mask)
        if (object <= 'c') {
          auto const monster_index = room.monster_id - 1;
          auto const monster_gfx = monster_data[monster_index].gfx - 1;
          auto const& monster_img = monster_images[monster_gfx];
          auto const& mask_img = monster_mask_images[monster_gfx];
          map_image.Blit(monster_img, mask_img, x * monster_img.GetWidth(),
                         y * monster_img.GetHeight());
          continue;
        }

        tile = GetObjectTile(object);
        auto mask = GetObjectTileMask(object);

        // Tiles no mask
        if (mask == 0) {
          auto const& obj_img = tile_images[tile];
          map_image.Blit(obj_img, x * obj_img.GetWidth(),
                         y * obj_img.GetHeight());
          continue;
        }

        // Tiles with mask
        auto const& obj_img = tile_images[tile];
        auto const& mask_img = tile_images[mask];
        map_image.Blit(obj_img, mask_img, x * obj_img.GetWidth(),
                       y * obj_img.GetHeight());
      }
    }

    // XXX: I'm relying on color_t to serialize properly without
    // intervention which may not be the case on non-x86 platforms
    auto const out_filename = out_prefix + std::to_string(room_index) + ".png";
    stbi_write_png(out_filename.c_str(), map_image.GetWidth(),
                   map_image.GetHeight(), kImageComponents,
                   map_image.GetData().data(),
                   map_image.GetWidth() * kImageComponents);
  }

  return 0;
}